

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.cc
# Opt level: O2

string * __thiscall
EvalString::Evaluate_abi_cxx11_(string *__return_storage_ptr__,EvalString *this,Env *env)

{
  pointer ppVar1;
  string asStack_48 [32];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (ppVar1 = (this->parsed_).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar1 != (this->parsed_).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar1 = ppVar1 + 1) {
    if (ppVar1->second == RAW) {
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      (*env->_vptr_Env[2])(asStack_48,env,ppVar1);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string(asStack_48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string EvalString::Evaluate(Env* env) const {
  string result;
  for (TokenList::const_iterator i = parsed_.begin(); i != parsed_.end(); ++i) {
    if (i->second == RAW)
      result.append(i->first);
    else
      result.append(env->LookupVariable(i->first));
  }
  return result;
}